

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

VPointF __thiscall
rlottie::internal::model::KeyFrames<VPointF,_void>::value
          (KeyFrames<VPointF,_void> *this,int frameNo)

{
  bool bVar1;
  const_reference pvVar2;
  reference this_00;
  int in_ESI;
  vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
  *in_RDI;
  VPointF VVar3;
  Frame *keyFrame;
  const_iterator __end0;
  const_iterator __begin0;
  vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
  *__range3;
  vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_rlottie::internal::model::KeyFrames<VPointF,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>_>
  local_28 [2];
  int local_14;
  VPointF local_8;
  
  local_14 = in_ESI;
  pvVar2 = std::
           vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
           ::front(in_RDI);
  if (pvVar2->start_ < (float)local_14) {
    pvVar2 = std::
             vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
             ::back(in_RDI);
    if ((float)local_14 < pvVar2->end_) {
      local_28[0]._M_current =
           (Frame *)std::
                    vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
                    ::begin(in_stack_ffffffffffffffb8);
      std::
      vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
      ::end(in_stack_ffffffffffffffb8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_rlottie::internal::model::KeyFrames<VPointF,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>_>
                                 *)in_RDI,
                                (__normal_iterator<const_rlottie::internal::model::KeyFrames<VPointF,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>_>
                                 *)in_stack_ffffffffffffffb8), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_rlottie::internal::model::KeyFrames<VPointF,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>_>
                  ::operator*(local_28);
        if ((this_00->start_ <= (float)local_14) && ((float)local_14 < this_00->end_)) {
          VVar3 = Frame::value(this_00,(int)((ulong)in_RDI >> 0x20));
          return VVar3;
        }
        __gnu_cxx::
        __normal_iterator<const_rlottie::internal::model::KeyFrames<VPointF,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>_>
        ::operator++(local_28);
      }
      memset(&local_8,0,8);
      VPointF::VPointF(&local_8);
    }
    else {
      pvVar2 = std::
               vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
               ::back(in_RDI);
      local_8 = (pvVar2->value_).end_;
    }
  }
  else {
    pvVar2 = std::
             vector<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
             ::front(in_RDI);
    local_8 = (pvVar2->value_).start_;
  }
  return local_8;
}

Assistant:

T value(int frameNo) const
    {
        if (frames_.front().start_ >= frameNo)
            return frames_.front().value_.start_;
        if (frames_.back().end_ <= frameNo) return frames_.back().value_.end_;

        for (const auto &keyFrame : frames_) {
            if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_)
                return keyFrame.value(frameNo);
        }
        return {};
    }